

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

float optimal_encode(const_matchp mp,_encode_match_data *emd)

{
  ushort uVar1;
  int *piVar2;
  undefined8 *puVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  piVar2 = (int *)emd->priv;
  uVar1 = mp->len;
  uVar4 = (uint)uVar1;
  if (mp->offset == 0) {
    *piVar2 = *piVar2 + uVar4;
    fVar6 = (float)uVar4 * 9.0 + 0.0;
  }
  else {
    puVar3 = *(undefined8 **)(piVar2 + 10);
    if (uVar1 != 1) {
      if (uVar1 == 2) {
        puVar3 = puVar3 + 1;
      }
      else {
        if (uVar4 == 0) {
          if (~LOG_DEBUG < G_log_level) {
            G_log_log_level = LOG_ERROR;
            log_log_default("bad len\n");
          }
          exit(1);
        }
        puVar3 = puVar3 + 7;
      }
    }
    fVar5 = (float)(**(code **)(piVar2 + 6))(mp->offset,*puVar3,emd->out);
    fVar6 = (float)(**(code **)(piVar2 + 8))(mp->len,*(undefined8 *)(piVar2 + 0xc),emd->out);
    fVar6 = fVar6 + fVar5 + 1.0;
    if (fVar6 <= (float)mp->len * 9.0) {
      if (mp->offset == 1) {
        piVar2[2] = piVar2[2] + 1;
        piVar2[5] = (int)((float)piVar2[5] + fVar6);
        return fVar6;
      }
      piVar2[1] = piVar2[1] + 1;
      piVar2[4] = (int)((float)piVar2[4] + fVar6);
      return fVar6;
    }
    *piVar2 = *piVar2 + 1;
  }
  piVar2[3] = (int)((float)piVar2[3] + fVar6);
  return fVar6;
}

Assistant:

float optimal_encode(const_matchp mp, encode_match_data emd)
{
    interval_nodep *offset;
    float bits;
    encode_match_privp data;

    data = emd->priv;
    offset = data->offset_f_priv;

    bits = 0.0;
    if (mp->offset == 0)
    {
        bits += 9.0f * mp->len;
        data->lit_num += mp->len;
        data->lit_bits += bits;
    } else
    {
        bits += 1.0;
        switch (mp->len)
        {
        case 0:
            LOG(LOG_ERROR, ("bad len\n"));
            exit(1);
            break;
        case 1:
            bits += data->offset_f(mp->offset, offset[0], emd->out);
            break;
        case 2:
            bits += data->offset_f(mp->offset, offset[1], emd->out);
            break;
        default:
            bits += data->offset_f(mp->offset, offset[7], emd->out);
            break;
        }
        bits += data->len_f(mp->len, data->len_f_priv, emd->out);
        if (bits > (9.0 * mp->len))
        {
            /* lets make literals out of it */
            data->lit_num += 1;
            data->lit_bits += bits;
        } else
        {
            if (mp->offset == 1)
            {
                data->rle_num += 1;
                data->rle_bits += bits;
            } else
            {
                data->seq_num += 1;
                data->seq_bits += bits;
            }
        }
    }
    return bits;
}